

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O2

void __thiscall
ManifestTest_normalize_path_randomized_Test::ManifestTest_normalize_path_randomized_Test
          (ManifestTest_normalize_path_randomized_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001c1a78;
  return;
}

Assistant:

TEST(ManifestTest, normalize_path_randomized) {
  const std::vector<std::string> componentVariants = { "", ".", "..", "a", "b" };

  std::default_random_engine generator;
  std::uniform_int_distribution<int> lengthDistribution(1, 5);
  std::uniform_int_distribution<int> componentDistribution(0, componentVariants.size() - 1);

  auto lengthDice = std::bind(lengthDistribution, generator);
  auto componentIndexDice = std::bind(componentDistribution, generator);

  bool atLeastOneTested = true;

  for (int n = 1; n < 1000; n++) {
    std::vector<std::string> pathComponents;
    const int length = lengthDice();

    for (int i = 0; i < length; i++) {
      pathComponents.push_back(componentVariants[componentIndexDice()]);
    }


    std::string path;
    for (auto &component : pathComponents) {
        path += "/" + component;
    }

    // Ignore path names with "network" prefixes, such as "//net".
    if (llvm::sys::path::root_name(path).size() != 0) {
      continue;
    } else {
      // Make sure we didn't ignore all test paths.
      atLeastOneTested = true;
    }

    EXPECT_EQ(normalize("/", path), normalize_path_model(pathComponents));
  }

  ASSERT_TRUE(atLeastOneTested);
}